

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int __thiscall Bstrlib::CBString::nreversefindchr(CBString *this,char *s,int pos)

{
  int iVar1;
  size_t sVar2;
  CBStringException *this_00;
  allocator local_71;
  string local_70;
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  
  if (s != (char *)0x0) {
    t.data = (uchar *)s;
    sVar2 = strlen(s);
    t.slen = (int)sVar2;
    t.mlen = -1;
    iVar1 = bninchrr(&this->super_tagbstring,pos,&t);
    return iVar1;
  }
  std::__cxx11::string::string
            ((string *)&local_70,"CBString::CBString::nreversefindchr NULL.",&local_71);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::nreversefindchr (const char * s, int pos) const {
struct tagbstring t;
	if (NULL == s) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::nreversefindchr NULL.");
#else
		return BSTR_ERR;
#endif
	}
	cstr2tbstr (t, s);
	return bninchrr ((bstring) this, pos, &t);
}